

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

void __thiscall jbcoin::STObject::setFieldV256(STObject *this,SField *field,STVector256 *v)

{
  STVector256 local_40;
  
  local_40.super_STBase.fName = (v->super_STBase).fName;
  local_40.super_STBase._vptr_STBase = (_func_int **)&PTR__STVector256_002d72a8;
  std::vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>::
  vector(&local_40.mValue,&v->mValue);
  setFieldUsingSetValue<jbcoin::STVector256,jbcoin::STVector256>(this,field,&local_40);
  local_40.super_STBase._vptr_STBase = (_func_int **)&PTR__STVector256_002d72a8;
  if (local_40.mValue.
      super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.mValue.
                    super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.mValue.
                          super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.mValue.
                          super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void STObject::setFieldV256 (SField const& field, STVector256 const& v)
{
    setFieldUsingSetValue <STVector256> (field, v);
}